

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f52c::evalCtors
          (anon_unknown_dwarf_5f52c *this,Module *wasm,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ctors,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *keptExports)

{
  _Link_type other;
  int *piVar1;
  __node_base_ptr *pp_Var2;
  Module **this_00;
  Type *this_01;
  long *plVar3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  Table *pTVar6;
  _func_int **pp_Var7;
  Module *pMVar8;
  Global *pGVar9;
  Memory *pMVar10;
  key_type *__k;
  key_type *__k_00;
  long lVar11;
  uintptr_t *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  _Base_ptr *pp_Var18;
  undefined8 module;
  undefined8 uVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var20;
  Builder BVar21;
  bool bVar22;
  char cVar23;
  uint uVar24;
  Builder BVar25;
  size_t *psVar26;
  undefined1 *puVar27;
  undefined8 *puVar28;
  Const *pCVar29;
  element_type *peVar30;
  _Rb_tree_node_base *p_Var31;
  _Rb_tree_node_base *p_Var32;
  SmallVector<wasm::Literal,_1UL> *this_02;
  HeapType type_00;
  mapped_type *pmVar33;
  long lVar34;
  ostream *poVar35;
  char *pcVar36;
  char *pcVar37;
  Function *function;
  ulong uVar38;
  Literal *this_03;
  Block *pBVar39;
  LocalSet *item;
  uintptr_t uVar40;
  EvallingModuleRunner *pEVar41;
  size_t sVar42;
  const_iterator cVar43;
  undefined8 *puVar44;
  IString *pIVar45;
  Expression *pEVar46;
  undefined8 *puVar47;
  undefined1 auVar48 [8];
  Type type_01;
  long extraout_RDX;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  long *plVar52;
  MixedArena *this_04;
  _Link_type __p;
  DataDrop *pDVar53;
  _Link_type p_Var54;
  iterator __begin2;
  _Base_ptr p_Var55;
  _Rb_tree_node_base *p_Var56;
  long lVar57;
  iterator __end2;
  Name *other_00;
  iterator __end2_1;
  iterator __begin2_2;
  Index *this_05;
  long lVar58;
  long lVar59;
  Name name;
  string_view sVar60;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar61;
  Name NVar62;
  IString IVar63;
  Name NVar64;
  Name NVar65;
  Name NVar66;
  Name NVar67;
  Name NVar68;
  Name name_00;
  Name name_01;
  Name NVar69;
  Name NVar70;
  Name NVar71;
  Name NVar72;
  Name root;
  optional<wasm::Type> type_02;
  undefined1 local_a38 [48];
  undefined1 local_a08 [40];
  uchar local_9e0 [8];
  undefined1 auStack_9d8 [8];
  CtorEvalExternalInterface envInterface;
  undefined1 local_8c0 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  EvallingModuleRunner instance;
  undefined1 local_648 [8];
  CtorEvalExternalInterface interface;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  *local_528;
  Literal local_508;
  undefined1 local_4f0 [8];
  Literal null;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> vStack_4d0;
  bool local_4b8;
  bool local_4b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_4a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_470;
  undefined1 auStack_438 [8];
  Literals results;
  Type type;
  undefined1 local_3d8 [8];
  Const size_1;
  bool local_3a0;
  undefined1 local_398 [8];
  Const zero;
  void *local_358 [2];
  long local_348;
  char local_340;
  void *local_338 [2];
  long local_328;
  char local_320;
  undefined1 auStack_318 [8];
  TableInstanceInfo info;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_2f8;
  HeapType HStack_2e0;
  char *pcStack_2d8;
  undefined1 auStack_188 [8];
  DataDrop drop;
  Type local_148;
  Type originalParams;
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  undefined1 local_120 [8];
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  HeapType originalFuncType;
  undefined1 auStack_d8 [8];
  Const size;
  __buckets_ptr local_a0;
  char *pcStack_98;
  undefined1 auStack_88 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localExprs;
  Builder local_68;
  Builder builder_1;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  Block *local_38;
  
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_8c0,ctors,keptExports,0,&keptExportsSet._M_h._M_single_bucket,auStack_318,
             auStack_9d8);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  BVar25.wasm = (Module *)operator_new(0x3f0);
  memset(BVar25.wasm,0,0x3f0);
  ::wasm::Module::Module(BVar25.wasm);
  builder_1.wasm = BVar25.wasm;
  sVar60 = (string_view)::wasm::IString::interned(3,"env",0);
  ((BVar25.wasm)->name).super_IString.str = sVar60;
  plVar52 = *(long **)(this + 0x18);
  plVar3 = *(long **)(this + 0x20);
  if (plVar52 != plVar3) {
    do {
      lVar58 = *plVar52;
      if ((*(char **)(lVar58 + 0x20) != (char *)0x0) &&
         (*(char **)(lVar58 + 0x20) == ((BVar25.wasm)->name).super_IString.str._M_str)) {
        instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
        super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
             0xffffffffffffff00;
        info.name.super_IString.str._M_str =
             (char *)((ulong)info.name.super_IString.str._M_str & 0xffffffffffffff00);
        psVar26 = (size_t *)
                  ::wasm::ModuleUtils::copyFunction
                            (lVar58,BVar25.wasm,0,0,&keptExportsSet._M_h._M_single_bucket,
                             auStack_318);
        if (((char)info.name.super_IString.str._M_str == '\x01') &&
           (info.name.super_IString.str._M_str =
                 (char *)((ulong)info.name.super_IString.str._M_str & 0xffffffffffffff00),
           auStack_318 != (undefined1  [8])0x0)) {
          operator_delete((void *)auStack_318,info.name.super_IString.str._M_len - (long)auStack_318
                         );
        }
        if (((char)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth ==
             '\x01') &&
           (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
                 instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
                 0xffffffffffffff00, keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0))
        {
          operator_delete(keptExportsSet._M_h._M_single_bucket,
                          (long)instance.
                                super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                                super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                                module - (long)keptExportsSet._M_h._M_single_bucket);
        }
        psVar26[5] = 0;
        psVar26[6] = 0;
        psVar26[3] = 0;
        psVar26[4] = 0;
        puVar27 = (undefined1 *)MixedArena::allocSpace(&(BVar25.wasm)->allocator,0x10,8);
        *puVar27 = 0x17;
        *(undefined8 *)(puVar27 + 8) = 1;
        psVar26[0xc] = (size_t)puVar27;
        p_Var4 = *(_func_int **)(lVar58 + 0x28);
        p_Var5 = *(_func_int **)(lVar58 + 0x30);
        auStack_9d8 = (undefined1  [8])*psVar26;
        envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)psVar26[1];
        local_648 = (undefined1  [8])operator_new(0x30);
        *(undefined1 (*) [8])((long)local_648 + 0x18) = auStack_9d8;
        *(_func_int ***)((long)local_648 + 0x20) =
             envInterface.super_ExternalInterface._vptr_ExternalInterface;
        *(_func_int **)local_648 = p_Var4;
        *(_func_int **)((long)local_648 + 8) = p_Var5;
        *(undefined4 *)((long)local_648 + 0x10) = 0;
        *(undefined1 *)((long)local_648 + 0x28) = 0;
        ::wasm::Module::addExport((unique_ptr *)BVar25.wasm);
        if (local_648 != (undefined1  [8])0x0) {
          operator_delete((void *)local_648,0x30);
        }
      }
      plVar52 = plVar52 + 1;
    } while (plVar52 != plVar3);
  }
  puVar44 = *(undefined8 **)(this + 0xb0);
  for (puVar47 = *(undefined8 **)(this + 0xa8); BVar21.wasm = builder_1.wasm, puVar47 != puVar44;
      puVar47 = puVar47 + 1) {
    pTVar6 = (Table *)*puVar47;
    pcVar36 = (pTVar6->super_Importable).module.super_IString.str._M_str;
    if ((pcVar36 != (char *)0x0) && (pcVar36 == ((BVar25.wasm)->name).super_IString.str._M_str)) {
      puVar28 = (undefined8 *)::wasm::ModuleUtils::copyTable(pTVar6,BVar25.wasm);
      puVar28[5] = 0;
      puVar28[6] = 0;
      puVar28[3] = 0;
      puVar28[4] = 0;
      pp_Var7 = (_func_int **)(pTVar6->super_Importable).base.super_IString.str._M_len;
      pMVar8 = (Module *)(pTVar6->super_Importable).base.super_IString.str._M_str;
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)*puVar28;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           (_func_int **)puVar28[1];
      auStack_318 = (undefined1  [8])operator_new(0x30);
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)keptExportsSet._M_h._M_single_bucket;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].type.id = (uintptr_t)
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                    _vptr_ExpressionRunner;
      (((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
       &((element_type *)auStack_318)->type)->
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>)._vptr_ExpressionRunner =
           pp_Var7;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)pMVar8;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.i32 = 1;
      *(undefined1 *)
       &(((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
      ::wasm::Module::addExport((unique_ptr *)BVar25.wasm);
      if (auStack_318 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_318,0x30);
      }
    }
  }
  puVar47 = *(undefined8 **)(this + 0x30);
  puVar44 = *(undefined8 **)(this + 0x38);
  if (puVar47 != puVar44) {
    pp_Var2 = &keptExportsSet._M_h._M_single_bucket;
    do {
      pGVar9 = (Global *)*puVar47;
      pcVar36 = (pGVar9->super_Importable).module.super_IString.str._M_str;
      if ((pcVar36 != (char *)0x0) && (pcVar36 == ((BVar25.wasm)->name).super_IString.str._M_str)) {
        psVar26 = (size_t *)::wasm::ModuleUtils::copyGlobal(pGVar9,BVar25.wasm);
        psVar26[5] = 0;
        psVar26[6] = 0;
        psVar26[3] = 0;
        psVar26[4] = 0;
        auStack_9d8 = (undefined1  [8])BVar21.wasm;
        ::wasm::Literal::makeZero((Type)pp_Var2);
        pCVar29 = ::wasm::Builder::makeConst((Builder *)auStack_9d8,(Literal *)pp_Var2);
        psVar26[8] = (size_t)pCVar29;
        ::wasm::Literal::~Literal((Literal *)pp_Var2);
        p_Var4 = (_func_int *)(pGVar9->super_Importable).base.super_IString.str._M_len;
        p_Var5 = (_func_int *)(pGVar9->super_Importable).base.super_IString.str._M_str;
        auStack_318 = (undefined1  [8])*psVar26;
        info.instance = (EvallingModuleRunner *)psVar26[1];
        local_648 = (undefined1  [8])operator_new(0x30);
        *(undefined1 (*) [8])((long)local_648 + 0x18) = auStack_318;
        *(EvallingModuleRunner **)((long)local_648 + 0x20) = info.instance;
        *(_func_int **)local_648 = p_Var4;
        *(_func_int **)((long)local_648 + 8) = p_Var5;
        *(undefined4 *)((long)local_648 + 0x10) = 3;
        *(undefined1 *)((long)local_648 + 0x28) = 0;
        ::wasm::Module::addExport((unique_ptr *)BVar21.wasm);
        BVar25.wasm = BVar21.wasm;
        if (local_648 != (undefined1  [8])0x0) {
          operator_delete((void *)local_648,0x30);
        }
      }
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar44);
  }
  BVar21.wasm = builder_1.wasm;
  puVar44 = *(undefined8 **)(this + 0x80);
  for (puVar47 = *(undefined8 **)(this + 0x78); puVar47 != puVar44; puVar47 = puVar47 + 1) {
    pMVar10 = (Memory *)*puVar47;
    pcVar36 = (pMVar10->super_Importable).module.super_IString.str._M_str;
    if ((pcVar36 != (char *)0x0) && (pcVar36 == ((BVar25.wasm)->name).super_IString.str._M_str)) {
      puVar28 = (undefined8 *)::wasm::ModuleUtils::copyMemory(pMVar10,BVar25.wasm);
      puVar28[5] = 0;
      puVar28[6] = 0;
      puVar28[3] = 0;
      puVar28[4] = 0;
      pp_Var7 = (_func_int **)(pMVar10->super_Importable).base.super_IString.str._M_len;
      pMVar8 = (Module *)(pMVar10->super_Importable).base.super_IString.str._M_str;
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)*puVar28;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           (_func_int **)puVar28[1];
      auStack_318 = (undefined1  [8])operator_new(0x30);
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)keptExportsSet._M_h._M_single_bucket;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].type.id = (uintptr_t)
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                    _vptr_ExpressionRunner;
      (((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
       &((element_type *)auStack_318)->type)->
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>)._vptr_ExpressionRunner =
           pp_Var7;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)pMVar8;
      (((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.i32 = 2;
      *(undefined1 *)
       &(((element_type *)auStack_318)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
      ::wasm::Module::addExport((unique_ptr *)BVar21.wasm);
      BVar25.wasm = BVar21.wasm;
      if (auStack_318 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_318,0x30);
      }
    }
  }
  local_a08._24_8_ = local_a08 + 8;
  local_a08._0_8_ = 0;
  local_a08._8_8_ = (_Base_ptr)0x0;
  local_a08._16_8_ = (_Base_ptr)0x0;
  local_9e0[0] = '\0';
  local_9e0[1] = '\0';
  local_9e0[2] = '\0';
  local_9e0[3] = '\0';
  local_9e0[4] = '\0';
  local_9e0[5] = '\0';
  local_9e0[6] = '\0';
  local_9e0[7] = '\0';
  p_Var54 = (_Link_type)local_a08;
  local_a08._32_8_ = local_a08._24_8_;
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)auStack_9d8,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var54);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_a08._16_8_,p_Var54);
  BVar25 = builder_1;
  peVar30 = (element_type *)operator_new(0x248);
  (peVar30->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (peVar30->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00175c08;
  this_05 = &(peVar30->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ = &instance;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x0;
  keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_;
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_05,BVar25.wasm,(ExternalInterface *)auStack_9d8,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&keptExportsSet._M_h._M_single_bucket);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module,
             (_Link_type)BVar25.wasm);
  BVar25 = builder_1;
  other_00 = &(builder_1.wasm)->name;
  p_Var56 = (_Rb_tree_node_base *)&linkedInstances;
  p_Var55 = (_Base_ptr)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar30;
  if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
LAB_0012550b:
    bVar22 = true;
  }
  else {
    do {
      p_Var32 = p_Var56;
      p_Var31 = p_Var55 + 1;
      bVar22 = ::wasm::IString::operator<((IString *)p_Var31,&other_00->super_IString);
      pp_Var18 = &p_Var55->_M_left;
      p_Var56 = p_Var55;
      if (bVar22) {
        p_Var56 = p_Var32;
      }
      p_Var55 = pp_Var18[bVar22];
    } while (pp_Var18[bVar22] != (_Base_ptr)0x0);
    if (p_Var56 == (_Rb_tree_node_base *)&linkedInstances) goto LAB_0012550b;
    if (bVar22) {
      p_Var31 = p_Var32 + 1;
    }
    bVar22 = ::wasm::IString::operator<(&other_00->super_IString,(IString *)p_Var31);
    if (!bVar22) goto LAB_00125675;
    bVar22 = false;
  }
  p_Var31 = (_Rb_tree_node_base *)operator_new(0x40);
  p_Var54 = (_Link_type)(p_Var31 + 1);
  p_Var55 = (_Base_ptr)((BVar25.wasm)->name).super_IString.str._M_str;
  *(size_t *)(p_Var31 + 1) = (other_00->super_IString).str._M_len;
  p_Var31[1]._M_parent = p_Var55;
  p_Var31[1]._M_left = (_Base_ptr)0x0;
  p_Var31[1]._M_right = (_Base_ptr)0x0;
  if (bVar22) {
    if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) ||
       (__p = p_Var54,
       bVar22 = ::wasm::IString::operator<
                          ((IString *)
                           (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                           ),(IString *)p_Var54), !bVar22)) {
LAB_0012560b:
      __p = p_Var54;
      pVar61 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
               ::_M_get_insert_unique_pos
                         ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                           *)local_120,(key_type *)p_Var54);
    }
    else {
LAB_0012561f:
      auVar14._8_8_ = 0;
      auVar14._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar61 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar14 << 0x40);
    }
LAB_00125622:
    p_Var56 = pVar61.first;
    if (pVar61.second == (_Rb_tree_node_base *)0x0) {
LAB_0012566a:
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
      ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                      *)p_Var31,__p);
      goto LAB_00125675;
    }
  }
  else {
    other = (_Link_type)(p_Var56 + 1);
    __p = other;
    bVar22 = ::wasm::IString::operator<((IString *)p_Var54,(IString *)other);
    if (!bVar22) {
      __p = p_Var54;
      bVar22 = ::wasm::IString::operator<((IString *)other,(IString *)p_Var54);
      if (bVar22) {
        if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var56)
        goto LAB_0012561f;
        p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var56);
        __p = (_Link_type)(p_Var32 + 1);
        bVar22 = ::wasm::IString::operator<((IString *)p_Var54,(IString *)__p);
        if (!bVar22) goto LAB_0012560b;
        pVar61.second = p_Var32;
        pVar61.first = p_Var32;
        if (p_Var56->_M_right == (_Base_ptr)0x0) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = p_Var56;
          pVar61 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar16 << 0x40);
          goto LAB_0012562d;
        }
        goto LAB_00125622;
      }
      goto LAB_0012566a;
    }
    pVar61.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pVar61.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == p_Var56)
    goto LAB_00125622;
    uVar51 = std::_Rb_tree_decrement(p_Var56);
    __p = p_Var54;
    bVar22 = ::wasm::IString::operator<((IString *)(uVar51 + 0x20),(IString *)p_Var54);
    if (!bVar22) goto LAB_0012560b;
    pVar61.second = p_Var56;
    pVar61.first = p_Var56;
    if (*(long *)(uVar51 + 0x18) != 0) goto LAB_00125622;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar51;
    pVar61 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar15 << 0x40);
  }
LAB_0012562d:
  p_Var56 = pVar61.second;
  bVar22 = true;
  if ((pVar61.first == (_Rb_tree_node_base *)0x0) &&
     ((_Rb_tree_node_base *)&linkedInstances != p_Var56)) {
    bVar22 = ::wasm::IString::operator<((IString *)p_Var54,(IString *)(p_Var56 + 1));
  }
  std::_Rb_tree_insert_and_rebalance(bVar22,p_Var31,p_Var56,(_Rb_tree_node_base *)&linkedInstances);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color + 1
       );
  p_Var56 = p_Var31;
LAB_00125675:
  p_Var56[1]._M_left = (_Base_ptr)this_05;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var56[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_a38,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_120);
  p_Var54 = (_Link_type)local_a38;
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)local_648,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var54);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_a38._16_8_,p_Var54);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Block_*>._M_engaged,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_120);
  p_Var54 = (_Link_type)this;
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket,(Module *)this,
             (ExternalInterface *)local_648,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Block_*>._M_engaged);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase(local_528,p_Var54);
  this_00 = &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm;
  (*(code *)((((instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                exceptionStack.flexible.
                super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.gcData.
              super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
            super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
            _M_str)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    exceptionStack.flexible.
                    super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00,
                    instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  puVar47 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x30);
  puVar44 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x38);
  if (puVar47 != puVar44) {
    do {
      __k = (key_type *)*puVar47;
      if (__k[2].super_IString.str._M_len == 0) {
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_318,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,
                   (Expression *)__k[4].super_IString.str._M_len);
        this_02 = &std::
                   map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                                 *)this_00,__k)->super_SmallVector<wasm::Literal,_1UL>;
        ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                  (this_02,(SmallVector<wasm::Literal,_1UL> *)auStack_318);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2f8);
        ::wasm::Literal::~Literal((Literal *)&info);
      }
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar44);
  }
  (**(code **)&((((instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   exceptionStack.flexible.
                   super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.gcData.
                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
               super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             exceptionStack.flexible.
             super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  plVar3 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                     0xb0);
  for (plVar52 = *(long **)(instance.
                            super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                            _24_8_ + 0xa8); plVar52 != plVar3; plVar52 = plVar52 + 1) {
    uVar51 = ((IString *)*plVar52)[5].str._M_len;
    if (((uint)uVar51 & 3) == 2 && 6 < uVar51) {
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                ((TableInstanceInfo *)auStack_318,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                 &keptExportsSet._M_h._M_single_bucket,(Name)((IString *)*plVar52)->str);
      type_00 = ::wasm::Type::getHeapType((Type *)(*plVar52 + 0x50));
      ::wasm::Literal::makeNull((Literal *)local_4f0,type_00);
      sVar42 = info.name.super_IString.str._M_len;
      pEVar41 = info.instance;
      auVar48 = auStack_318;
      if (*(long *)(*plVar52 + 0x38) != 0) {
        uVar51 = 0;
        do {
          (*(*(ExternalInterface **)((long)auVar48 + 0x200))->_vptr_ExternalInterface[0x1c])
                    (*(ExternalInterface **)((long)auVar48 + 0x200),pEVar41,sVar42,uVar51,local_4f0)
          ;
          uVar51 = uVar51 + 1;
        } while (uVar51 < *(ulong *)(*plVar52 + 0x38));
      }
      ::wasm::Literal::~Literal((Literal *)local_4f0);
    }
  }
  local_398[0] = '\x0e';
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  zero.value.field_0.i64 = 0;
  zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_318 = (undefined1  [8])((ulong)auStack_318 & 0xffffffff00000000);
  info.name.super_IString.str._M_len = 2;
  ::wasm::Literal::operator=
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             (Literal *)auStack_318);
  ::wasm::Literal::~Literal((Literal *)auStack_318);
  ::wasm::Const::finalize();
  plVar52 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      0x60);
  plVar3 = *(long **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                     0x68);
  if (plVar52 != plVar3) {
    do {
      psVar26 = (size_t *)*plVar52;
      if (psVar26[4] != 0) {
        auStack_d8[0] = 0xe;
        size.value.field_0.i64 = 0;
        size.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        auStack_318._0_4_ = (int)(psVar26[8] - psVar26[7] >> 3);
        info.name.super_IString.str._M_len = 2;
        ::wasm::Literal::operator=
                  ((Literal *)
                   &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                   (Literal *)auStack_318);
        ::wasm::Literal::~Literal((Literal *)auStack_318);
        ::wasm::Const::finalize();
        auStack_318[0] = 0x33;
        info.instance = (EvallingModuleRunner *)0x0;
        HStack_2e0.id = psVar26[3];
        pcStack_2d8 = (char *)psVar26[4];
        info.name.super_IString.str._M_len = *psVar26;
        info.name.super_IString.str._M_str = (char *)psVar26[1];
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)psVar26[5];
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_398;
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auStack_d8;
        ::wasm::TableInit::finalize();
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)local_4f0,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,(Expression *)auStack_318);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4d0);
        ::wasm::Literal::~Literal(&null);
        local_3d8 = (undefined1  [8])
                    &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     droppedDataSegments._M_h._M_single_bucket;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_3d8,psVar26,local_3d8);
        ::wasm::Literal::~Literal
                  ((Literal *)
                   &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      }
      plVar52 = plVar52 + 1;
    } while (plVar52 != plVar3);
  }
  ::wasm::Literal::~Literal
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  puVar47 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x78);
  puVar44 = *(undefined8 **)
             (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x80);
  if (puVar47 != puVar44) {
    do {
      __k_00 = (key_type *)*puVar47;
      pmVar33 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&instance.
                                 super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                 .droppedElementSegments._M_h._M_single_bucket,__k_00);
      pmVar33->addr = (address64_t)__k_00[3].super_IString.str._M_str;
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar44);
  }
  lVar58 = *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                    0x98) -
           *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                    0x90);
  if (lVar58 != 0) {
    lVar58 = lVar58 >> 3;
    lVar57 = 0;
    do {
      lVar59 = *(long *)(instance.
                         super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_
                        + 0x90);
      lVar11 = *(long *)(lVar59 + lVar57 * 8);
      if (*(char *)(lVar11 + 0x28) == '\0') {
        NVar62.super_IString.str._M_str = *(char **)(lVar11 + 0x18);
        NVar62.super_IString.str._M_len._0_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
        NVar62.super_IString.str._M_len._4_4_ =
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
        lVar34 = ::wasm::Module::getMemory(NVar62);
        local_398[0] = '\x0e';
        zero.value.field_0.i64 = 0;
        zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        ::wasm::Literal::makeFromInt32((Literal *)auStack_318,0,(Type)*(uintptr_t *)(lVar34 + 0x50))
        ;
        ::wasm::Literal::operator=
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                   (Literal *)auStack_318);
        ::wasm::Literal::~Literal((Literal *)auStack_318);
        ::wasm::Const::finalize();
        local_3d8[0] = 0xe;
        size_1.value.field_0.i64 = 0;
        size_1.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        lVar11 = *(long *)(lVar59 + lVar57 * 8);
        ::wasm::Literal::makeFromInt32
                  ((Literal *)auStack_318,*(int *)(lVar11 + 0x40) - *(int *)(lVar11 + 0x38),
                   (Type)*(uintptr_t *)(lVar34 + 0x50));
        this_01 = &size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
        ::wasm::Literal::operator=((Literal *)this_01,(Literal *)auStack_318);
        ::wasm::Literal::~Literal((Literal *)auStack_318);
        ::wasm::Const::finalize();
        auStack_318[0] = 0x24;
        info.instance = (EvallingModuleRunner *)0x0;
        lVar11 = *(long *)(lVar59 + lVar57 * 8);
        HStack_2e0.id = *(size_t *)(lVar11 + 0x18);
        pcStack_2d8 = *(char **)(lVar11 + 0x20);
        psVar26 = *(size_t **)(lVar59 + lVar57 * 8);
        info.name.super_IString.str._M_len = *psVar26;
        info.name.super_IString.str._M_str = (char *)psVar26[1];
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(*(long *)(lVar59 + lVar57 * 8) + 0x30);
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_398;
        local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_3d8;
        ::wasm::MemoryInit::finalize();
        auStack_188[0] = 0x25;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
        puVar12 = *(uintptr_t **)(lVar59 + lVar57 * 8);
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = *puVar12;
        drop.segment.super_IString.str._M_len = puVar12[1];
        ::wasm::DataDrop::finalize();
        pp_Var2 = &keptExportsSet._M_h._M_single_bucket;
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)local_4f0,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pp_Var2,
                   (Expression *)auStack_318);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4d0);
        ::wasm::Literal::~Literal(&null);
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_d8,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pp_Var2,
                   (Expression *)auStack_188);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &size.value.field_0.func.super_IString.str._M_str);
        ::wasm::Literal::~Literal((Literal *)&size);
        ::wasm::Literal::~Literal((Literal *)this_01);
        ::wasm::Literal::~Literal
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      }
      lVar57 = lVar57 + 1;
    } while (lVar58 + (ulong)(lVar58 == 0) != lVar57);
  }
  pcVar36 = *(char **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      200);
  if (pcVar36 != (char *)0x0) {
    local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.name.super_IString.str._M_len = 0;
    info.name.super_IString.str._M_str = (char *)0x0;
    auStack_318 = (undefined1  [8])0x0;
    info.instance = (EvallingModuleRunner *)0x0;
    local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar42 = *(size_t *)
              (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0xc0);
    ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_d8,
               (SmallVector<wasm::Literal,_1UL> *)auStack_318);
    name.super_IString.str._M_str = pcVar36;
    name.super_IString.str._M_len = sVar42;
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
              ((Literals *)local_4f0,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               &keptExportsSet._M_h._M_single_bucket,name,(Literals *)auStack_d8);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&vStack_4d0);
    ::wasm::Literal::~Literal(&null);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &size.value.field_0.func.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&size);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2f8);
    ::wasm::Literal::~Literal((Literal *)&info);
  }
  interface.usedGlobalNames._M_h._M_single_bucket._0_1_ = 1;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_50 != pbVar13) {
    do {
      if ((anonymous_namespace)::quiet == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"trying to eval ",0xf);
        poVar35 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                             local_50->_M_string_length);
        auStack_318[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar35,auStack_318,1);
      }
      pcVar36 = (char *)::wasm::IString::interned
                                  (local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
      NVar64.super_IString.str._M_str = pcVar36;
      NVar64.super_IString.str._M_len = (size_t)this;
      lVar58 = ::wasm::Module::getExportOrNull(NVar64);
      if ((lVar58 == 0) || (*(int *)(lVar58 + 0x10) != 0)) {
        ::wasm::Fatal::Fatal((Fatal *)auStack_318);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&info.name,"export not found: ",0x12);
        ::wasm::Fatal::operator<<((Fatal *)auStack_318,local_50);
        ::wasm::Fatal::~Fatal((Fatal *)auStack_318);
      }
      puVar47 = (undefined8 *)(lVar58 + 0x18);
      if (*(char *)(lVar58 + 0x28) != '\0') {
        puVar47 = (undefined8 *)0x0;
      }
      envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar47;
      pcVar36 = (char *)puVar47[1];
      pcVar37 = (char *)::wasm::IString::interned
                                  (local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
      module = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
      NVar65.super_IString.str._M_str =
           (char *)envInstance.
                   super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
      NVar65.super_IString.str._M_len._0_4_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
      NVar65.super_IString.str._M_len._4_4_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
      function = (Function *)::wasm::Module::getFunction(NVar65);
      if ((function->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
        if ((anonymous_namespace)::quiet == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping since could not eval: call import: ",0x31)
          ;
          pcVar36 = (function->super_Importable).module.super_IString.str._M_str;
          auStack_318 = (undefined1  [8])&info.name;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_318,pcVar36,
                     pcVar36 + (function->super_Importable).module.super_IString.str._M_len);
          poVar35 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)auStack_318,(long)info.instance);
          std::__ostream_insert<char,std::char_traits<char>>(poVar35,".",1);
          pcVar36 = (function->super_Importable).base.super_IString.str._M_str;
          auStack_d8 = (undefined1  [8])
                       &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                        type;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_d8,pcVar36,
                     pcVar36 + (function->super_Importable).base.super_IString.str._M_len);
          poVar35 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar35,(char *)auStack_d8,
                               size.super_SpecificExpression<(wasm::Expression::Id)14>.
                               super_Expression._0_8_);
          local_398[0] = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar35,local_398,1);
          if (auStack_d8 !=
              (undefined1  [8])
              &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type) {
            operator_delete((void *)auStack_d8,
                            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression
                            .type.id + 1);
          }
          if (auStack_318 != (undefined1  [8])&info.name) {
            operator_delete((void *)auStack_318,info.name.super_IString.str._M_len + 1);
          }
        }
LAB_00126e0d:
        if ((anonymous_namespace)::quiet == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping\n",0xe);
        }
        std::_Optional_payload_base<wasm::Literals>::_M_reset
                  ((_Optional_payload_base<wasm::Literals> *)local_3d8);
        break;
      }
      lVar58 = ::wasm::Function::getNumParams();
      if ((lVar58 != 0) && ((anonymous_namespace)::ignoreExternalInput == '\0')) {
        if ((anonymous_namespace)::quiet == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping due to params\n",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\n       recommendation: consider --ignore-external-input",0x38);
        }
        goto LAB_00126e0d;
      }
      drop.segment.super_IString.str._M_str = (char *)0x0;
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = 0;
      drop.segment.super_IString.str._M_len = 0;
      auStack_188 = (undefined1  [8])0x0;
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
      uVar51 = 0;
      while( true ) {
        uVar38 = ::wasm::Function::getNumParams();
        if (uVar38 <= uVar51) break;
        auStack_318 = (undefined1  [8])::wasm::Function::getLocalType((uint)function);
        cVar23 = ::wasm::Type::isDefaultable();
        if (cVar23 == '\0') {
          if ((anonymous_namespace)::quiet == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n",0x28);
          }
          local_3a0 = false;
          goto LAB_00126a8c;
        }
        ::wasm::Literal::makeZero((Type)auStack_318);
        ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_188,(Literal *)auStack_318);
        ::wasm::Literal::~Literal((Literal *)auStack_318);
        uVar51 = (ulong)((int)uVar51 + 1);
      }
      auStack_88 = (undefined1  [8])0x0;
      localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      do {
        local_68.wasm = (Module *)module;
        local_38 = (Block *)function->body;
        if ((local_38 == (Block *)0x0) ||
           ((local_38->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
            BlockId)) {
          local_38 = ::wasm::Builder::makeBlock(&local_68,(Expression *)local_38);
        }
        ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
        FunctionScope((FunctionScope *)local_398,function,(Literals *)auStack_188,
                      (EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket);
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
        str._M_str = (char *)0x0;
        auStack_438 = (undefined1  [8])0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        sVar42 = (local_38->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
        if (sVar42 == 0) {
          uVar24 = 0;
        }
        else {
          uVar24 = 0;
          uVar51 = 0;
          do {
            if ((local_38->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements <= uVar51) goto LAB_00126fa1;
            local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            HStack_2e0.id = 0;
            local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_2f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            info.name.super_IString.str._M_len = 0;
            info.name.super_IString.str._M_str = (char *)0x0;
            auStack_318 = (undefined1  [8])0x0;
            info.instance = (EvallingModuleRunner *)0x0;
            pcStack_2d8 = (char *)0x0;
            ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                      ((Flow *)auStack_d8,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                       &keptExportsSet._M_h._M_single_bucket,
                       (local_38->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data[uVar51]);
            ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_318,
                       (SmallVector<wasm::Literal,_1UL> *)auStack_d8);
            HStack_2e0.id = (uintptr_t)local_a0;
            pcStack_2d8 = pcStack_98;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &size.value.field_0.func.super_IString.str._M_str);
            ::wasm::Literal::~Literal((Literal *)&size);
            if (pcStack_2d8 == _extendLowUToI32x4) {
              if ((anonymous_namespace)::quiet == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  ...stopping due to non-constant flow\n",0x27);
              }
LAB_00126164:
              bVar17 = true;
              iVar50 = 8;
              bVar22 = false;
            }
            else if (pcStack_2d8 == _replaceLaneI64x2) {
              this_03 = ::wasm::SmallVector<wasm::Literal,_1UL>::back
                                  ((SmallVector<wasm::Literal,_1UL> *)auStack_318);
              NVar62 = ::wasm::Literal::getFunc(this_03);
              uVar19 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
              NVar66.super_IString.str._M_str = NVar62.super_IString.str._M_len;
              instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations
                   = (Index)module;
              instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
                   SUB84(module,4);
              NVar66.super_IString.str._M_len._0_4_ =
                   instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                   maxLoopIterations;
              NVar66.super_IString.str._M_len._4_4_ =
                   instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                   relaxedBehavior;
              instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar19;
              function = (Function *)::wasm::Module::getFunction(NVar66);
              ::wasm::SmallVector<wasm::Literal,_1UL>::pop_back
                        ((SmallVector<wasm::Literal,_1UL> *)auStack_318);
              ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                        ((SmallVector<wasm::Literal,_1UL> *)auStack_188,
                         (SmallVector<wasm::Literal,_1UL> *)auStack_318);
              if ((undefined1  [8])
                  localExprs.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != auStack_88) {
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)auStack_88;
              }
              lVar58 = (-(long)drop.segment.super_IString.str._M_str >> 3) * -0x5555555555555555 +
                       (long)auStack_188;
              if (lVar58 != 0) {
                lVar59 = -0x18;
                lVar57 = 0;
                do {
                  pDVar53 = (DataDrop *)(drop.segment.super_IString.str._M_str + lVar59);
                  if (lVar57 == 0) {
                    pDVar53 = &drop;
                  }
                  ::wasm::Literal::Literal(&local_508,(Literal *)pDVar53);
                  auStack_d8 = (undefined1  [8])
                               CtorEvalExternalInterface::getSerialization
                                         ((CtorEvalExternalInterface *)local_648,&local_508,
                                          (Name)ZEXT816(0));
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_88,(Expression **)auStack_d8);
                  ::wasm::Literal::~Literal(&local_508);
                  lVar57 = lVar57 + 1;
                  lVar59 = lVar59 + 0x18;
                } while (lVar58 != lVar57);
              }
              CtorEvalExternalInterface::applyToModule((CtorEvalExternalInterface *)local_648);
              iVar50 = 5;
              bVar22 = false;
              bVar17 = false;
            }
            else {
              if ((undefined1  [8])
                  localExprs.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != auStack_88) {
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)auStack_88;
              }
              uVar49 = 0;
              while( true ) {
                uVar38 = ::wasm::Function::getNumLocals();
                if (uVar38 <= uVar49) break;
                auStack_d8 = (undefined1  [8])
                             CtorEvalExternalInterface::getSerialization
                                       ((CtorEvalExternalInterface *)local_648,
                                        (Literals *)
                                        ((ulong)uVar49 * 0x38 +
                                        CONCAT71(local_398._1_7_,local_398[0])),(Name)ZEXT816(0));
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88
                           ,(Expression **)auStack_d8);
                uVar49 = uVar49 + 1;
              }
              CtorEvalExternalInterface::applyToModule((CtorEvalExternalInterface *)local_648);
              auStack_438 = auStack_318;
              ::wasm::Literal::operator=((Literal *)&results,(Literal *)&info);
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                         &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
                         &local_2f8);
              if (pcStack_2d8 != (char *)0x0) {
                if ((anonymous_namespace)::quiet == '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"  ...stopping in block due to break\n",0x24);
                }
                uVar24 = (uint)(local_38->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               .usedElements;
                goto LAB_00126164;
              }
              uVar24 = uVar24 + 1;
              bVar17 = false;
              bVar22 = true;
              iVar50 = 0;
            }
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_2f8);
            ::wasm::Literal::~Literal((Literal *)&info);
            if (!bVar22) {
              if (!bVar17) goto LAB_001269f8;
              break;
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != sVar42);
        }
        if ((((function->super_Importable).module.super_IString.str._M_str == (char *)0x0) &&
            ((local_38->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             <= (ulong)uVar24)) ||
           (((uVar24 == 0 &&
             ((function->super_Importable).super_Named.name.super_IString.str._M_str == pcVar36)) &&
            (((undefined1  [8])
              localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start == auStack_88 ||
             (lVar58 = ::wasm::HeapType::getSignature(), lVar58 == 0)))))) {
LAB_001269c3:
          if ((local_38->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements == (ulong)uVar24) {
            ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)local_3d8,
                       (SmallVector<wasm::Literal,_1UL> *)auStack_438);
            local_3a0 = true;
          }
          else {
            local_3a0 = false;
          }
        }
        else {
          _Var20._M_pi = envInstance.
                         super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          uVar19 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
          NVar67.super_IString.str._M_str =
               (char *)envInstance.
                       super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations =
               (Index)module;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
               SUB84(module,4);
          NVar67.super_IString.str._M_len._0_4_ =
               instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations
          ;
          NVar67.super_IString.str._M_len._4_4_ =
               instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar19;
          lVar58 = ::wasm::Module::getFunction(NVar67);
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
               *(size_t *)(lVar58 + 0x38);
          root.super_IString.str._M_str = pcVar36;
          root.super_IString.str._M_len = (size_t)_Var20._M_pi;
          IVar63.str = (string_view)::wasm::Names::getValidFunctionName((Module *)module,root);
          uVar19 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
          NVar68.super_IString.str._M_str = pcVar37;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations =
               (Index)module;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior =
               SUB84(module,4);
          NVar68.super_IString.str._M_len._0_4_ =
               instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations
          ;
          NVar68.super_IString.str._M_len._4_4_ =
               instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
          instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ = uVar19;
          lVar58 = ::wasm::Module::getExport(NVar68);
          sVar42 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
          pIVar45 = (IString *)(lVar58 + 0x18);
          if (*(char *)(lVar58 + 0x28) != '\0') {
            pIVar45 = (IString *)0x0;
          }
          pIVar45->str = IVar63.str;
          if ((function->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
            auStack_318 = (undefined1  [8])0x0;
            info.instance = (EvallingModuleRunner *)0x0;
            info.name.super_IString.str._M_str =
                 (char *)std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                         ::_M_invoke;
            info.name.super_IString.str._M_len =
                 (size_t)std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                         ::_M_manager;
            pBVar39 = (Block *)::wasm::ExpressionManipulator::flexibleCopy
                                         (function->body,module,(Expression *)auStack_318);
            if (info.name.super_IString.str._M_len != 0) {
              (*(code *)info.name.super_IString.str._M_len)
                        ((Expression *)auStack_318,(Expression *)auStack_318,3);
            }
            if ((pBVar39 == (Block *)0x0) ||
               ((pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
                BlockId)) {
              pBVar39 = ::wasm::Builder::makeBlock(&local_68,(Expression *)pBVar39);
            }
            if (uVar24 != 0) {
              uVar51 = 0;
              do {
                pEVar46 = (Expression *)MixedArena::allocSpace(&(local_68.wasm)->allocator,0x10,8);
                pEVar46->_id = NopId;
                (pEVar46->type).id = 0;
                if ((pBVar39->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements <= uVar51) {
LAB_00126fa1:
                  __assert_fail("index < usedElements",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                ,0xbc,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                (pBVar39->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [uVar51] = pEVar46;
                uVar51 = uVar51 + 1;
              } while (uVar24 != uVar51);
            }
            this_04 = &(local_68.wasm)->allocator;
            pEVar46 = (Expression *)MixedArena::allocSpace(this_04,0x40,8);
            pEVar46->_id = BlockId;
            (pEVar46->type).id = 0;
            *(undefined8 *)(pEVar46 + 1) = 0;
            pEVar46[1].type.id = 0;
            *(undefined8 *)(pEVar46 + 2) = 0;
            pEVar46[2].type.id = 0;
            *(undefined8 *)(pEVar46 + 3) = 0;
            pEVar46[3].type.id = (uintptr_t)this_04;
            if ((undefined1  [8])
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start != auStack_88) {
              uVar51 = 0;
              do {
                item = ::wasm::Builder::makeLocalSet
                                 (&local_68,(Index)uVar51,*(pointer)((long)auStack_88 + uVar51 * 8))
                ;
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pEVar46 + 2),(Expression *)item);
                uVar51 = (ulong)((Index)uVar51 + 1);
              } while (uVar51 < (ulong)((long)localExprs.
                                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                        (long)auStack_88 >> 3));
            }
            type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 1;
            type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)
                 (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                 id;
            pBVar39 = ::wasm::Builder::makeSequence(&local_68,pEVar46,(Expression *)pBVar39,type_02)
            ;
            auStack_d8 = (undefined1  [8])0x0;
            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId
            ;
            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
            size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
            local_148.id = ::wasm::HeapType::getSignature();
            uVar40 = ::wasm::HeapType::getSignature();
            if (local_148.id != uVar40) {
              originalParams.id = ::wasm::HeapType::getSignature();
              info.instance = (EvallingModuleRunner *)0x0;
              auStack_318 = (undefined1  [8])&originalParams;
              pEVar41 = (EvallingModuleRunner *)::wasm::Type::size(&originalParams);
              bVar22 = auStack_318 != (undefined1  [8])&originalParams;
              if (info.instance == pEVar41) goto LAB_001267a7;
              do {
                do {
                  puVar47 = (undefined8 *)::wasm::Type::Iterator::operator*((Iterator *)auStack_318)
                  ;
                  results.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)*puVar47;
                  if (size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_
                      == size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                         type.id) {
                    std::vector<wasm::Type,std::allocator<wasm::Type>>::
                    _M_realloc_insert<wasm::Type_const&>
                              ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_d8,
                               (iterator)
                               size.super_SpecificExpression<(wasm::Expression::Id)14>.
                               super_Expression._0_8_,
                               (Type *)&results.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    *(pointer *)
                     size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_
                         = results.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                    size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
                         size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                         _0_8_ + 8;
                  }
                  info.instance =
                       (EvallingModuleRunner *)
                       ((long)&((info.instance)->
                               super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                               _vptr_ExpressionRunner + 1);
                  bVar22 = auStack_318 != (undefined1  [8])&originalParams;
                } while (info.instance != pEVar41);
LAB_001267a7:
              } while (bVar22);
              sVar42 = ::wasm::Type::size(&local_148);
              if (sVar42 != 0) {
                ::wasm::FindAll<wasm::LocalGet>::FindAll
                          ((FindAll<wasm::LocalGet> *)auStack_318,(Expression *)pBVar39);
                for (auVar48 = auStack_318; auVar48 != (undefined1  [8])info.instance;
                    auVar48 = (undefined1  [8])
                              &(((Function *)auVar48)->super_Importable).super_Named.name.
                               super_IString.str._M_str) {
                  piVar1 = (int *)((((Function *)auVar48)->super_Importable).super_Named.name.
                                   super_IString.str._M_len + 0x10);
                  *piVar1 = *piVar1 + (int)sVar42;
                }
                if (auStack_318 != (undefined1  [8])0x0) {
                  operator_delete((void *)auStack_318,
                                  info.name.super_IString.str._M_len - (long)auStack_318);
                }
                ::wasm::FindAll<wasm::LocalSet>::FindAll
                          ((FindAll<wasm::LocalSet> *)auStack_318,(Expression *)pBVar39);
                for (auVar48 = auStack_318; auVar48 != (undefined1  [8])info.instance;
                    auVar48 = (undefined1  [8])
                              &(((Function *)auVar48)->super_Importable).super_Named.name.
                               super_IString.str._M_str) {
                  piVar1 = (int *)((((Function *)auVar48)->super_Importable).super_Named.name.
                                   super_IString.str._M_len + 0x10);
                  *piVar1 = *piVar1 + (int)sVar42;
                }
                if (auStack_318 != (undefined1  [8])0x0) {
                  operator_delete((void *)auStack_318,
                                  info.name.super_IString.str._M_len - (long)auStack_318);
                }
              }
            }
            std::vector<wasm::Type,std::allocator<wasm::Type>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>>
                      ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_d8,
                       size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                       _0_8_,(function->vars).
                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                             super__Vector_impl_data._M_start,
                       (function->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            name_01.super_IString.str._M_str = (char *)IVar63.str._M_len;
            name_01.super_IString.str._M_len = (size_t)auStack_318;
            ::wasm::Builder::makeFunction
                      (name_01,(HeapType)IVar63.str._M_str,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Expression *)auStack_d8);
            ::wasm::Module::addFunction((unique_ptr *)module);
            if (auStack_318 != (undefined1  [8])0x0) {
              std::default_delete<wasm::Function>::operator()
                        ((default_delete<wasm::Function> *)auStack_318,(Function *)auStack_318);
            }
            local_4f0._0_2_ = 0x100;
            local_4f0[2] = '\x01';
            null.field_0._4_8_ = 0xffffffff00000002;
            null.field_0._12_4_ = 0x14;
            null.type.id._0_1_ = 0;
            local_4b8 = false;
            local_4b0 = false;
            vStack_4d0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._4_5_ = 0;
            null.type.id._4_4_ = 0;
            vStack_4d0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ = false;
            vStack_4d0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start._1_1_ = false;
            vStack_4d0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start._2_1_ = false;
            vStack_4d0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start._3_1_ = false;
            local_4a8._M_buckets = &local_4a8._M_single_bucket;
            local_4a8._M_bucket_count = 1;
            local_4a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_4a8._M_element_count = 0;
            local_4a8._M_rehash_policy._M_max_load_factor = 1.0;
            local_4a8._M_rehash_policy._M_next_resize = 0;
            local_4a8._M_single_bucket = (__node_base_ptr)0x0;
            local_470._M_buckets = &local_470._M_single_bucket;
            local_470._M_bucket_count = 1;
            local_470._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_470._M_element_count = 0;
            local_470._M_rehash_policy._M_max_load_factor = 1.0;
            local_470._M_rehash_policy._M_next_resize = 0;
            local_470._M_single_bucket = (__node_base_ptr)0x0;
            stack0xfffffffffffffb14 = 0x100000002;
            ::wasm::PassRunner::PassRunner
                      ((PassRunner *)auStack_318,(Module *)module,(PassOptions *)local_4f0);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&local_470);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_4a8);
            ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
            ::wasm::PassRunner::runOnFunction((Function *)auStack_318);
            ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_318);
            if (auStack_d8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_d8,
                              size.super_SpecificExpression<(wasm::Expression::Id)14>.
                              super_Expression.type.id - (long)auStack_d8);
            }
            goto LAB_001269c3;
          }
          auStack_318 = (undefined1  [8])0x0;
          info.instance = (EvallingModuleRunner *)0x0;
          info.name.super_IString.str._M_len = 0;
          sVar60 = (function->super_Importable).super_Named.name.super_IString.str;
          ::wasm::HeapType::getSignature();
          ::wasm::Builder::makeCall
                    (&local_68,(Name)sVar60,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88,
                     type_01,true);
          name_00.super_IString.str._M_str = (char *)IVar63.str._M_len;
          name_00.super_IString.str._M_len = (size_t)auStack_d8;
          ::wasm::Builder::makeFunction
                    (name_00,(HeapType)IVar63.str._M_str,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)sVar42,
                     (Expression *)auStack_318);
          if (auStack_318 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_318,
                            info.name.super_IString.str._M_len - (long)auStack_318);
          }
          ::wasm::Module::addFunction((unique_ptr *)module);
          local_3a0 = false;
          if (auStack_d8 != (undefined1  [8])0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)auStack_d8,(Function *)auStack_d8);
          }
        }
        iVar50 = 1;
LAB_001269f8:
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        ::wasm::Literal::~Literal((Literal *)&results);
        *(uintptr_t *)(zero.value.field_0.func.super_IString.str._M_str + 0x138) =
             zero.value.type.id;
        *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x70) =
             *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x70) + -1;
        *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x80) =
             *(long *)(zero.value.field_0.func.super_IString.str._M_str + 0x80) + -0x10;
        std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
                  ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)local_398);
      } while (iVar50 == 5);
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)localExprs.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
LAB_00126a8c:
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &drop.segment.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&drop);
      if ((local_3a0 & 1U) == 0) goto LAB_00126e0d;
      if ((anonymous_namespace)::quiet == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  ...success on ",0x10);
        poVar35 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                             local_50->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar35,".\n",2);
      }
      pcVar36 = (char *)::wasm::IString::interned
                                  (local_50->_M_string_length,(local_50->_M_dataplus)._M_p,0);
      NVar69.super_IString.str._M_str = pcVar36;
      NVar69.super_IString.str._M_len = (size_t)this;
      puVar47 = (undefined8 *)::wasm::Module::getExport(NVar69);
      cVar43 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_8c0,local_50);
      if (cVar43.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        NVar71.super_IString.str._M_str = (char *)*puVar47;
        NVar71.super_IString.str._M_len = (size_t)this;
        ::wasm::Module::removeExport(NVar71);
      }
      else {
        pcVar36 = (char *)0x0;
        if (*(int *)(puVar47 + 2) == 0) {
          puVar44 = puVar47 + 3;
          if (*(char *)(puVar47 + 5) != '\0') {
            puVar44 = (undefined8 *)0x0;
          }
          pcVar36 = (char *)*puVar44;
        }
        NVar70.super_IString.str._M_str = pcVar36;
        NVar70.super_IString.str._M_len = (size_t)this;
        pIVar45 = (IString *)::wasm::Module::getFunction(NVar70);
        IVar63.str = (string_view)::wasm::Names::getValidFunctionName((Module *)this,pIVar45->str);
        local_340 = '\0';
        local_320 = '\0';
        lVar58 = ::wasm::ModuleUtils::copyFunction
                           (pIVar45,this,IVar63.str._M_len,IVar63.str._M_str,local_358,local_338);
        if ((local_320 == '\x01') && (local_320 = '\0', local_338[0] != (void *)0x0)) {
          operator_delete(local_338[0],local_328 - (long)local_338[0]);
        }
        if ((local_340 == '\x01') && (local_340 = '\0', local_358[0] != (void *)0x0)) {
          operator_delete(local_358[0],local_348 - (long)local_358[0]);
        }
        ::wasm::HeapType::getSignature();
        if (extraout_RDX == 0) {
          pEVar46 = (Expression *)MixedArena::allocSpace((MixedArena *)(this + 0x200),0x10,8);
          pEVar46->_id = NopId;
          (pEVar46->type).id = 0;
        }
        else {
          pEVar46 = CtorEvalExternalInterface::getSerialization
                              ((CtorEvalExternalInterface *)local_648,(Literals *)local_3d8,
                               (Name)ZEXT816(0));
        }
        *(Expression **)(lVar58 + 0x60) = pEVar46;
        NVar72.super_IString.str._M_str = (char *)*puVar47;
        NVar72.super_IString.str._M_len = (size_t)this;
        lVar58 = ::wasm::Module::getExport(NVar72);
        pIVar45 = (IString *)(lVar58 + 0x18);
        if (*(char *)(lVar58 + 0x28) != '\0') {
          pIVar45 = (IString *)0x0;
        }
        pIVar45->str = IVar63.str;
      }
      std::_Optional_payload_base<wasm::Literals>::_M_reset
                ((_Optional_payload_base<wasm::Literals> *)local_3d8);
      local_50 = local_50 + 1;
    } while (local_50 != pbVar13);
  }
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
             &keptExportsSet._M_h._M_single_bucket);
  local_648 = (undefined1  [8])&PTR__CtorEvalExternalInterface_001759f0;
  while ((undefined8 *)interface.definingGlobals._M_h._M_bucket_count != (undefined8 *)0x0) {
    puVar47 = *(undefined8 **)interface.definingGlobals._M_h._M_bucket_count;
    operator_delete((void *)interface.definingGlobals._M_h._M_bucket_count,0x28);
    interface.definingGlobals._M_h._M_bucket_count = (size_type)puVar47;
  }
  p_Var54 = (_Link_type)0x0;
  memset((void *)interface.MaximumMemory,0,(long)interface.definingGlobals._M_h._M_buckets << 3);
  interface.definingGlobals._M_h._M_bucket_count = 0;
  interface.definingGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&interface.definingGlobals._M_h._M_rehash_policy._M_next_resize !=
      (size_t *)interface.MaximumMemory) {
    p_Var54 = (_Link_type)((long)interface.definingGlobals._M_h._M_buckets << 3);
    operator_delete((void *)interface.MaximumMemory,(ulong)p_Var54);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&interface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,p_Var54
            );
  if (envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               envInstance.
               super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  auStack_9d8 = (undefined1  [8])&PTR__CtorEvalExternalInterface_001759f0;
  while ((undefined8 *)envInterface.definingGlobals._M_h._M_bucket_count != (undefined8 *)0x0) {
    puVar47 = *(undefined8 **)envInterface.definingGlobals._M_h._M_bucket_count;
    operator_delete((void *)envInterface.definingGlobals._M_h._M_bucket_count,0x28);
    envInterface.definingGlobals._M_h._M_bucket_count = (size_type)puVar47;
  }
  p_Var54 = (_Link_type)0x0;
  memset((void *)envInterface.MaximumMemory,0,
         (long)envInterface.definingGlobals._M_h._M_buckets << 3);
  envInterface.definingGlobals._M_h._M_bucket_count = 0;
  envInterface.definingGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&envInterface.definingGlobals._M_h._M_rehash_policy._M_next_resize !=
      (size_t *)envInterface.MaximumMemory) {
    p_Var54 = (_Link_type)((long)envInterface.definingGlobals._M_h._M_buckets << 3);
    operator_delete((void *)envInterface.MaximumMemory,(ulong)p_Var54);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&envInterface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             p_Var54);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&builder_1);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,p_Var54);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_8c0);
  return;
}

Assistant:

void evalCtors(Module& wasm,
               std::vector<std::string>& ctors,
               std::vector<std::string>& keptExports) {
  std::unordered_set<std::string> keptExportsSet(keptExports.begin(),
                                                 keptExports.end());

  std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances;

  // build and link the env module
  auto envModule = buildEnvModule(wasm);
  CtorEvalExternalInterface envInterface;
  auto envInstance =
    std::make_shared<EvallingModuleRunner>(*envModule, &envInterface);
  linkedInstances[envModule->name] = envInstance;

  CtorEvalExternalInterface interface(linkedInstances);
  try {
    // create an instance for evalling
    EvallingModuleRunner instance(wasm, &interface, linkedInstances);
    instance.instantiate();
    interface.instanceInitialized = true;
    // go one by one, in order, until we fail
    // TODO: if we knew priorities, we could reorder?
    for (auto& ctor : ctors) {
      if (!quiet) {
        std::cout << "trying to eval " << ctor << '\n';
      }
      Export* ex = wasm.getExportOrNull(ctor);
      if (!ex || ex->kind != ExternalKind::Function) {
        Fatal() << "export not found: " << ctor;
      }
      auto funcName = *ex->getInternalName();
      auto outcome = evalCtor(instance, interface, funcName, ctor);
      if (!outcome) {
        if (!quiet) {
          std::cout << "  ...stopping\n";
        }
        return;
      }

      // Success! And we can continue to try more.
      if (!quiet) {
        std::cout << "  ...success on " << ctor << ".\n";
      }

      // Remove the export if we should.
      auto* exp = wasm.getExport(ctor);
      if (!keptExportsSet.count(ctor)) {
        wasm.removeExport(exp->name);
      } else {
        // We are keeping around the export, which should now refer to an
        // empty function since calling the export should do nothing.
        auto* func = wasm.getFunction((exp->kind == ExternalKind::Function)
                                        ? *exp->getInternalName()
                                        : Name());
        auto copyName = Names::getValidFunctionName(wasm, func->name);
        auto* copyFunc = ModuleUtils::copyFunction(func, wasm, copyName);
        if (func->getResults() == Type::none) {
          copyFunc->body = Builder(wasm).makeNop();
        } else {
          copyFunc->body = interface.getSerialization(*outcome);
        }
        *wasm.getExport(exp->name)->getInternalName() = copyName;
      }
    }
  } catch (FailToEvalException& fail) {
    // that's it, we failed to even create the instance
    if (!quiet) {
      std::cout << "  ...stopping since could not create module instance: "
                << fail.why << "\n";
    }
    return;
  }
}